

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O3

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char **ppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  FILE *__s1;
  int iVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  char *__format;
  uint uVar9;
  CommandOptions *pCVar10;
  int iVar11;
  allocator<char> local_c9;
  CommandOptions *local_c8;
  ui32_t *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this->error_flag = true;
  this->key_flag = false;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  *(undefined4 *)((long)&this->fb_dump_size + 3) = 0;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  ppcVar1 = &this->input_filename;
  paVar2 = &(this->prefix_buffer).field_2;
  (this->edit_rate).Numerator = 0;
  (this->edit_rate).Denominator = 0;
  this->file_prefix = (char *)0x0;
  this->input_filename = (char *)0x0;
  this->extension = (char *)0x0;
  this->g_stream_sid = 0;
  (this->prefix_buffer)._M_dataplus._M_p = (pointer)paVar2;
  (this->prefix_buffer)._M_string_length = 0;
  (this->prefix_buffer).field_2._M_local_buf[0] = '\0';
  this->key_id_value[0] = '\0';
  this->key_id_value[1] = '\0';
  this->key_id_value[2] = '\0';
  this->key_id_value[3] = '\0';
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  this->key_value[0] = '\0';
  this->key_value[1] = '\0';
  this->key_value[2] = '\0';
  this->key_value[3] = '\0';
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_value[0xc] = '\0';
  this->key_value[0xd] = '\0';
  this->key_value[0xe] = '\0';
  this->key_value[0xf] = '\0';
  pCVar10 = this;
  local_c8 = this;
  if (1 < argc) {
    local_c0 = &this->fb_dump_size;
    iVar11 = 1;
    local_b8 = paVar2;
    do {
      __s1 = (FILE *)argv[iVar11];
      this = (CommandOptions *)__s1;
      iVar4 = strcmp((char *)__s1,"-help");
      if (iVar4 == 0) {
        pCVar10->help_flag = true;
      }
      else if ((char)__s1->_flags == '-') {
        cVar3 = *(char *)((long)&__s1->_flags + 1);
        uVar9 = (uint)cVar3;
        this = (CommandOptions *)(ulong)uVar9;
        iVar4 = isalpha(uVar9);
        pCVar10 = local_c8;
        if ((9 < uVar9 - 0x30 && iVar4 == 0) || (*(char *)((long)&__s1->_flags + 2) != '\0')) {
          __format = "Unrecognized argument: %s\n";
          goto LAB_0010c6bb;
        }
        switch(cVar3) {
        case 'V':
          local_c8->version_flag = true;
          break;
        case 'W':
          local_c8->no_write_flag = true;
          break;
        case 'X':
        case 'Y':
        case '[':
        case '\\':
        case ']':
        case '^':
        case '_':
        case '`':
        case 'a':
        case 'c':
        case 'i':
        case 'j':
        case 'k':
        case 'l':
        case 'n':
        case 'o':
        case 'q':
        case 'r':
        case 't':
        case 'u':
        case 'x':
        case 'y':
switchD_0010c28f_caseD_58:
          __format = "Unrecognized option: %s\n";
LAB_0010c6bb:
          fprintf(_stderr,__format,__s1);
          return;
        case 'Z':
          local_c8->j2c_pedantic = false;
          break;
        case 'b':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) ||
             (this = (CommandOptions *)argv[iVar11], (char)((FILE *)this)->_flags == '-')) {
            CommandOptions(this);
            return;
          }
          lVar6 = strtol((char *)this,(char **)0x0,10);
          lVar5 = -lVar6;
          if (0 < lVar6) {
            lVar5 = lVar6;
          }
          pCVar10->fb_size = (ui32_t)lVar5;
          if (pCVar10->verbose_flag == true) {
            this = (CommandOptions *)_stderr;
            fprintf(_stderr,"Frame Buffer size: %u bytes.\n");
          }
          break;
        case 'd':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) ||
             (this = (CommandOptions *)argv[iVar11], (char)((FILE *)this)->_flags == '-')) {
            CommandOptions(this);
            return;
          }
          local_c8->duration_flag = true;
          lVar6 = strtol((char *)this,(char **)0x0,10);
          lVar5 = -lVar6;
          if (0 < lVar6) {
            lVar5 = lVar6;
          }
          pCVar10->duration = (ui32_t)lVar5;
          break;
        case 'e':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) || (*argv[iVar11] == '-')) {
            CommandOptions(this);
            return;
          }
          local_c8->extension = argv[iVar11];
          break;
        case 'f':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) ||
             (this = (CommandOptions *)argv[iVar11], (char)((FILE *)this)->_flags == '-')) {
            CommandOptions(this);
            return;
          }
          lVar6 = strtol((char *)this,(char **)0x0,10);
          lVar5 = -lVar6;
          if (0 < lVar6) {
            lVar5 = lVar6;
          }
          pCVar10->start_frame = (ui32_t)lVar5;
          break;
        case 'g':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) ||
             (this = (CommandOptions *)argv[iVar11], (char)((FILE *)this)->_flags == '-')) {
            CommandOptions(this);
            return;
          }
          lVar5 = strtol((char *)this,(char **)0x0,10);
          pCVar10->g_stream_sid = (i32_t)lVar5;
          break;
        case 'h':
          local_c8->help_flag = true;
          break;
        case 'm':
          local_c8->read_hmac = true;
          break;
        case 'p':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) ||
             (this = (CommandOptions *)argv[iVar11], (char)((FILE *)this)->_flags == '-')) {
            CommandOptions(this);
            return;
          }
          lVar6 = strtol((char *)this,(char **)0x0,10);
          lVar5 = -lVar6;
          if (0 < lVar6) {
            lVar5 = lVar6;
          }
          pCVar10->picture_rate = (ui32_t)lVar5;
          break;
        case 's':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) ||
             (this = (CommandOptions *)argv[iVar11], (char)((FILE *)this)->_flags == '-')) {
            CommandOptions(this);
            return;
          }
          lVar6 = strtol((char *)this,(char **)0x0,10);
          lVar5 = -lVar6;
          if (0 < lVar6) {
            lVar5 = lVar6;
          }
          *local_c0 = (ui32_t)lVar5;
          break;
        case 'v':
          local_c8->verbose_flag = true;
          break;
        case 'w':
          iVar11 = iVar11 + 1;
          if ((argc <= iVar11) ||
             (this = (CommandOptions *)argv[iVar11], (char)((FILE *)this)->_flags == '-')) {
            CommandOptions(this);
            return;
          }
          lVar6 = strtol((char *)this,(char **)0x0,10);
          lVar5 = -lVar6;
          if (0 < lVar6) {
            lVar5 = lVar6;
          }
          pCVar10->number_width = (ui32_t)lVar5;
          break;
        case 'z':
          local_c8->j2c_pedantic = true;
          break;
        default:
          if (cVar3 == '2') {
            local_c8->split_wav = true;
          }
          else {
            if (cVar3 != '1') goto switchD_0010c28f_caseD_58;
            local_c8->mono_wav = true;
          }
        }
      }
      else if (*ppcVar1 == (char *)0x0) {
        *ppcVar1 = (char *)__s1;
      }
      else if (pCVar10->file_prefix == (char *)0x0) {
        pCVar10->file_prefix = (char *)__s1;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < argc);
    if ((pCVar10->help_flag & 1U) != 0) {
      return;
    }
  }
  if (pCVar10->version_flag == false) {
    if (*ppcVar1 == (char *)0x0) {
      CommandOptions(this);
    }
    else {
      if (pCVar10->file_prefix == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,*ppcVar1,&local_c9);
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
        Kumu::PathSetExtension((string *)local_70,(string *)local_90);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_70);
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_40 = *plVar8;
          lStack_38 = plVar7[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar8;
          local_50 = (long *)*plVar7;
        }
        local_48 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&pCVar10->prefix_buffer,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        pCVar10 = local_c8;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        pCVar10->file_prefix = (pCVar10->prefix_buffer)._M_dataplus._M_p;
      }
      pCVar10->error_flag = false;
    }
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), key_flag(false), read_hmac(false), split_wav(false),
    mono_wav(false), verbose_flag(false), fb_dump_size(0), no_write_flag(false),
    version_flag(false), help_flag(false), number_width(6),
    start_frame(0), duration(0xffffffff), duration_flag(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_prefix(0),
    input_filename(0), extension(0), g_stream_sid(0)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }
         
	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'e':
		TEST_EXTRA_ARG(i, 'e');
		extension = argv[i];
		break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'g':
		TEST_EXTRA_ARG(i, 'g');
		g_stream_sid = strtol(argv[i], 0, 10);
		break;
		  
	      case 'h': help_flag = true; break;
	      case 'm': read_hmac = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		if ( input_filename == 0 )
		  {
		    input_filename = argv[i];
		  }
		else if ( file_prefix == 0 )
		  {
		    file_prefix = argv[i];
		  }
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    if ( input_filename == 0 )
      {
	fputs("At least one filename argument is required.\n", stderr);
	return;
      }

    if ( file_prefix == 0 )
      {
	prefix_buffer = Kumu::PathSetExtension(input_filename, "") + "_";
	file_prefix = prefix_buffer.c_str();
      }

    error_flag = false;
  }